

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O3

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,9ul>,int,int,int,int,int,int>
               (SmallVector<(anonymous_namespace)::Constructable,_9UL> *v,int *args,int *args_1,
               int *args_2,int *args_3,int *args_4,int *args_5)

{
  int iVar1;
  undefined1 uVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  StringRef macroName;
  StringRef capturedExpression;
  array<int,_6UL> a;
  AssertionHandler catchAssertionHandler;
  int local_78 [4];
  undefined4 local_68;
  undefined4 local_64;
  ITransientExpression local_60;
  AssertionHandler local_50;
  
  local_78[0] = (int)args;
  local_78[1] = (int)args_1;
  local_78[2] = (int)args_2;
  local_78[3] = (int)args_3;
  local_68 = SUB84(args_4,0);
  local_64 = args_5._0_4_;
  local_60._vptr_ITransientExpression = (_func_int **)0xa004f0;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = false;
  local_60._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x36;
  capturedExpression.m_start = "std::ranges::equal(v, a, {}, &Constructable::getValue)";
  Catch::AssertionHandler::AssertionHandler
            (&local_50,macroName,(SourceLineInfo *)&local_60,capturedExpression,ContinueOnFailure);
  if ((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len == 6) {
    piVar3 = local_78;
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)&((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).
                              data_)->value + lVar4);
      iVar5 = -iVar1;
      if (0 < iVar1) {
        iVar5 = iVar1;
      }
      if (iVar5 != *piVar3) goto LAB_00547d04;
      piVar3 = piVar3 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x30);
    uVar2 = 1;
  }
  else {
LAB_00547d04:
    uVar2 = 0;
  }
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c896a0;
  local_60._8_8_ = (ulong)CONCAT52(local_60._11_5_,CONCAT11(uVar2,uVar2)) << 8;
  Catch::AssertionHandler::handleExpr(&local_50,&local_60);
  Catch::AssertionHandler::complete(&local_50);
  if (local_50.m_completed == false) {
    (*(local_50.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}